

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ColumnRef __thiscall
clickhouse::ColumnVector<int>::Slice(ColumnVector<int> *this,size_t begin,size_t len)

{
  size_t in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ColumnRef CVar1;
  shared_ptr<clickhouse::ColumnVector<int>_> *in_stack_ffffffffffffff88;
  element_type *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd8;
  
  this_01 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8;
  this_00 = in_RDI;
  SliceVector<int>(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  std::make_shared<clickhouse::ColumnVector<int>,std::vector<int,std::allocator<int>>>
            (in_stack_ffffffffffffffb8);
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<int>,void>
            ((shared_ptr<clickhouse::Column> *)this_00,in_stack_ffffffffffffff88);
  std::shared_ptr<clickhouse::ColumnVector<int>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<int>_> *)0x2148d1);
  std::vector<int,_std::allocator<int>_>::~vector(this_01);
  CVar1.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ColumnRef)CVar1.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnVector<T>::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnVector<T>>(SliceVector(data_, begin, len));
}